

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::RadialTangentialDistortion::getProperties
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  string local_48;
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,this->kd);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RadialTangentialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("p1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("p2", id).c_str(), kd[1]);

  prop.putValue(getCameraKey("k1", id).c_str(), kd[2]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[3]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[4]);
}